

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void phmap::priv::ConvertDeletedToEmptyAndFullToDeleted(ctrl_t *ctrl,size_t capacity)

{
  char *pcVar1;
  byte *pbVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  undefined8 uVar18;
  ulong uVar19;
  ctrl_t *pcVar20;
  
  if (ctrl[capacity] != -1) {
    __assert_fail("ctrl[capacity] == kSentinel",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                  ,0x270,"void phmap::priv::ConvertDeletedToEmptyAndFullToDeleted(ctrl_t *, size_t)"
                 );
  }
  if ((capacity != 0) && ((capacity + 1 & capacity) == 0)) {
    pcVar20 = ctrl + capacity;
    for (uVar19 = 0; capacity + 1 != uVar19; uVar19 = uVar19 + 0x10) {
      pcVar1 = ctrl + uVar19;
      cVar3 = pcVar1[1];
      cVar4 = pcVar1[2];
      cVar5 = pcVar1[3];
      cVar6 = pcVar1[4];
      cVar7 = pcVar1[5];
      cVar8 = pcVar1[6];
      cVar9 = pcVar1[7];
      cVar10 = pcVar1[8];
      cVar11 = pcVar1[9];
      cVar12 = pcVar1[10];
      cVar13 = pcVar1[0xb];
      cVar14 = pcVar1[0xc];
      cVar15 = pcVar1[0xd];
      cVar16 = pcVar1[0xe];
      cVar17 = pcVar1[0xf];
      pbVar2 = (byte *)(ctrl + uVar19);
      *pbVar2 = -(*pcVar1 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[1] = -(cVar3 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[2] = -(cVar4 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[3] = -(cVar5 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[4] = -(cVar6 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[5] = -(cVar7 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[6] = -(cVar8 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[7] = -(cVar9 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[8] = -(cVar10 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[9] = -(cVar11 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[10] = -(cVar12 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xb] = -(cVar13 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xc] = -(cVar14 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xd] = -(cVar15 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xe] = -(cVar16 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xf] = -(cVar17 < '\0') & 0x7eU ^ 0xfe;
    }
    uVar18 = *(undefined8 *)(ctrl + 8);
    *(undefined8 *)(pcVar20 + 1) = *(undefined8 *)ctrl;
    *(undefined8 *)(pcVar20 + 9) = uVar18;
    *pcVar20 = -1;
    return;
  }
  __assert_fail("IsValidCapacity(capacity)",
                "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                ,0x271,"void phmap::priv::ConvertDeletedToEmptyAndFullToDeleted(ctrl_t *, size_t)");
}

Assistant:

inline void ConvertDeletedToEmptyAndFullToDeleted(
		    ctrl_t* ctrl, size_t capacity)
		{
			assert(ctrl[capacity] == kSentinel);
			assert(IsValidCapacity(capacity));
			for (ctrl_t* pos = ctrl; pos != ctrl + capacity + 1; pos += Group::kWidth) {
				Group{pos}.ConvertSpecialToEmptyAndFullToDeleted(pos);
			}
			// Copy the cloned ctrl bytes.
			std::memcpy(ctrl + capacity + 1, ctrl, Group::kWidth);
			ctrl[capacity] = kSentinel;
		}